

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::MessageOptions::MergeFrom(MessageOptions *this,MessageOptions *from)

{
  uint uVar1;
  void *pvVar2;
  
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(from->uninterpreted_option_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      this->message_set_wire_format_ = from->message_set_wire_format_;
    }
    if ((uVar1 & 2) != 0) {
      this->no_standard_descriptor_accessor_ = from->no_standard_descriptor_accessor_;
    }
    if ((uVar1 & 4) != 0) {
      this->deprecated_ = from->deprecated_;
    }
    if ((uVar1 & 8) != 0) {
      this->map_entry_ = from->map_entry_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void MessageOptions::MergeFrom(const MessageOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.MessageOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      message_set_wire_format_ = from.message_set_wire_format_;
    }
    if (cached_has_bits & 0x00000002u) {
      no_standard_descriptor_accessor_ = from.no_standard_descriptor_accessor_;
    }
    if (cached_has_bits & 0x00000004u) {
      deprecated_ = from.deprecated_;
    }
    if (cached_has_bits & 0x00000008u) {
      map_entry_ = from.map_entry_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}